

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * __thiscall
Diligent::GetUsageString(Diligent::USAGE)::UsageToStringMap::operator[](Diligent::USAGE__const
          (void *this,USAGE Usage)

{
  const_reference ppcVar1;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  USAGE Usage_local;
  UsageToStringMap *this_local;
  
  msg.field_2._M_local_buf[0xf] = Usage;
  if (Usage < USAGE_NUM_USAGES) {
    ppcVar1 = std::array<const_char_*,_6UL>::operator[]
                        ((array<const_char_*,_6UL> *)this,(ulong)Usage);
    this_local = (UsageToStringMap *)*ppcVar1;
  }
  else {
    FormatString<char[14]>((string *)local_40,(char (*) [14])"Unknown usage");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x453);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (UsageToStringMap *)anon_var_dwarf_735687;
  }
  return (Char *)this_local;
}

Assistant:

const Char* operator[](USAGE Usage) const
        {
            if (Usage >= USAGE_IMMUTABLE && Usage < USAGE_NUM_USAGES)
                return UsageStrings[Usage];
            else
            {
                UNEXPECTED("Unknown usage");
                return "Unknown usage";
            }
        }